

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O0

ssize_t __thiscall
anon_unknown.dwarf_1acb919::WriterSpy::write(WriterSpy *this,int __fd,void *__buf,size_t __n)

{
  element_type *peVar1;
  ulong uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined4 in_register_00000034;
  bool bVar5;
  string local_50 [8];
  string buf;
  char *chars;
  size_t n_local;
  void *buffer_local;
  WriterSpy *this_local;
  
  peVar1 = std::__shared_ptr_access<dap::Writer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<dap::Writer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->w);
  uVar2 = (**(code **)((long)*peVar1 + 0x20))(peVar1,CONCAT44(in_register_00000034,__fd),__buf);
  bVar5 = (uVar2 & 1) != 0;
  if (bVar5) {
    buf.field_2._8_8_ = CONCAT44(in_register_00000034,__fd);
    std::__cxx11::string::string(local_50,(string *)&this->prefix);
    std::__cxx11::string::append<char_const*,void>
              (local_50,(char *)buf.field_2._8_8_,(char *)(buf.field_2._8_8_ + (long)__buf));
    peVar1 = std::__shared_ptr_access<dap::Writer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<dap::Writer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->s);
    uVar3 = std::__cxx11::string::data();
    uVar4 = std::__cxx11::string::size();
    (**(code **)((long)*peVar1 + 0x20))(peVar1,uVar3,uVar4);
    uVar2 = std::__cxx11::string::~string(local_50);
  }
  return CONCAT71((int7)(uVar2 >> 8),bVar5);
}

Assistant:

bool write(const void* buffer, size_t n) override {
    if (!w->write(buffer, n)) {
      return false;
    }
    auto chars = reinterpret_cast<const char*>(buffer);
    std::string buf = prefix;
    buf.append(chars, chars + n);
    s->write(buf.data(), buf.size());
    return true;
  }